

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O0

int libssh2_userauth_publickey_fromfile_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,char *publickey,char *privatekey,
              char *passphrase)

{
  int iVar1;
  time_t start_time;
  time_t entry_time;
  char *pcStack_38;
  int rc;
  char *passphrase_local;
  char *privatekey_local;
  char *publickey_local;
  uint user_len_local;
  char *user_local;
  LIBSSH2_SESSION *session_local;
  
  pcStack_38 = passphrase;
  if (passphrase == (char *)0x0) {
    pcStack_38 = "";
  }
  start_time = time((time_t *)0x0);
  while( true ) {
    iVar1 = userauth_publickey_fromfile
                      (session,user,(ulong)user_len,publickey,privatekey,pcStack_38);
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) break;
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return -0x25;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_publickey_fromfile_ex(LIBSSH2_SESSION *session,
                                       const char *user,
                                       unsigned int user_len,
                                       const char *publickey,
                                       const char *privatekey,
                                       const char *passphrase)
{
    int rc;

    if(NULL == passphrase)
        /* if given a NULL pointer, make it point to a zero-length
           string to save us from having to check this all over */
        passphrase = "";

    BLOCK_ADJUST(rc, session,
                 userauth_publickey_fromfile(session, user, user_len,
                                             publickey, privatekey,
                                             passphrase));
    return rc;
}